

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

Result<wasm::Ok> *
wasm::WATParser::makeArrayCopy<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  undefined1 *puVar1;
  undefined8 *puVar2;
  undefined1 local_c8 [8];
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> destType;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined1 local_80 [8];
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> srcType;
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> _val_1;
  
  typeidx<wasm::WATParser::ParseDefsCtx>
            ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> *)
             local_c8,ctx);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     *)local_80,
                    (_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     *)local_c8);
  if (srcType.val.
      super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      ._M_u._24_1_ == '\x01') {
    puVar1 = (undefined1 *)
             ((long)&_val_1.val.
                     super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     .
                     super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     .
                     super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     .
                     super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     .
                     super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
             + 8);
    srcType.val.
    super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
    .
    super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
    .
    super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
    .
    super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
    .
    super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
    .
    super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
    ._32_8_ = puVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               ((long)&srcType.val.
                       super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
               + 0x20),local_80,
               (long)srcType.val.
                     super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     .
                     super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     .
                     super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     .
                     super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     .
                     super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     .
                     super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     ._M_u._M_first._M_storage.type.id + (long)local_80);
    puVar2 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar2;
    if ((undefined1 *)
        srcType.val.
        super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        ._32_8_ == puVar1) {
      *puVar2 = _val_1.val.
                super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                .
                super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                .
                super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                .
                super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                .
                super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                .
                super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                ._M_u._8_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
           _val_1.val.
           super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
           .
           super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
           .
           super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
           .
           super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
           .
           super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
           .
           super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
           ._M_u._16_8_;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
           srcType.val.
           super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
           .
           super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
           .
           super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
           .
           super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
           .
           super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
           .
           super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
           ._32_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
           _val_1.val.
           super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
           .
           super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
           .
           super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
           .
           super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
           .
           super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
           .
           super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
           ._M_u._8_8_;
    }
    ((HeapType *)
    ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8))->id =
         (uintptr_t)
         _val_1.val.
         super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
         .
         super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
         .
         super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
         .
         super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
         .
         super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
         .
         super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
         ._M_u._M_first._M_storage.type.id;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
  }
  else {
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                         *)local_80);
    typeidx<wasm::WATParser::ParseDefsCtx>
              ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> *)
               local_80,ctx);
    std::__detail::__variant::
    _Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                       *)((long)&srcType.val.
                                 super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                 .
                                 super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                 .
                                 super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                 .
                                 super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                 .
                                 super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                         + 0x20),
                      (_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                       *)local_80);
    if (_val_1.val.
        super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        ._M_u._24_1_ == '\x01') {
      destType.val.
      super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      ._32_8_ = &local_90;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 ((long)&destType.val.
                         super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                 + 0x20),srcType.val.
                         super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                         ._32_8_,
                 (long)_val_1.val.
                       super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                       ._M_u._M_first._M_storage.type.id +
                 srcType.val.
                 super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                 ._32_8_);
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar2;
      if ((undefined8 *)
          destType.val.
          super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
          ._32_8_ == &local_90) {
        *puVar2 = local_90;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_88;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
             destType.val.
             super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
             .
             super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
             ._32_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) = local_90;
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_98;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           *)((long)&srcType.val.
                                     super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                     .
                                     super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                             + 0x20));
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           *)((long)&srcType.val.
                                     super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                     .
                                     super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                             + 0x20));
      ParseDefsCtx::makeArrayCopy
                (__return_storage_ptr__,ctx,pos,annotations,(HeapType)local_c8,(HeapType)local_80);
    }
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
  ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                       *)local_80);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
  ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                       *)local_c8);
  return __return_storage_ptr__;
}

Assistant:

Result<>
makeArrayCopy(Ctx& ctx, Index pos, const std::vector<Annotation>& annotations) {
  auto destType = typeidx(ctx);
  CHECK_ERR(destType);
  auto srcType = typeidx(ctx);
  CHECK_ERR(srcType);
  return ctx.makeArrayCopy(pos, annotations, *destType, *srcType);
}